

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitTupleMake(InfoCollector *this,TupleMake *curr)

{
  CollectedFuncInfo *this_00;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Expression **ppEVar4;
  ExpressionLocation local_88;
  ExpressionLocation local_78;
  undefined1 local_68 [68];
  uint local_24;
  Type TStack_20;
  Index i;
  TupleMake *local_18;
  TupleMake *curr_local;
  InfoCollector *this_local;
  
  TStack_20.id = (curr->super_SpecificExpression<(wasm::Expression::Id)57>).super_Expression.type.id
  ;
  local_18 = curr;
  curr_local = (TupleMake *)this;
  bVar1 = isRelevant(this,TStack_20);
  if (bVar1) {
    for (local_24 = 0; uVar2 = (ulong)local_24,
        sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&(local_18->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ), uVar2 < sVar3; local_24 = local_24 + 1) {
      this_00 = this->info;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_24);
      local_78.expr = *ppEVar4;
      local_78.tupleIndex = 0;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)local_68,&local_78);
      local_88.expr = (Expression *)local_18;
      local_88.tupleIndex = local_24;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)(local_68 + 0x20),&local_88);
      std::
      vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
      ::push_back(&this_00->links,(value_type *)local_68);
    }
  }
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    if (isRelevant(curr->type)) {
      for (Index i = 0; i < curr->operands.size(); i++) {
        info.links.push_back({ExpressionLocation{curr->operands[i], 0},
                              ExpressionLocation{curr, i}});
      }
    }
  }